

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

int64_t av1_lowbd_pixel_proj_error_avx2
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i v_00;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *pvVar12;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  void *in_stack_00000008;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_0000002c;
  int64_t sum [4];
  __m256i sum64_1_2;
  __m256i sum64_0_2;
  int32_t e_2;
  __m256i err0_2;
  __m256i diff0;
  __m256i s0_2;
  __m256i d0_2;
  __m256i sum32_2;
  __m256i sum64_1_1;
  __m256i sum64_0_1;
  int32_t e_1;
  int32_t v_1;
  int32_t u_1;
  __m256i err0_1;
  __m256i e0_1;
  __m256i vr1_1;
  __m256i vr0_1;
  __m256i v1_1;
  __m256i v0_1;
  __m256i flt_16b;
  __m256i s0_1;
  __m256i d0_1;
  __m256i sum32_1;
  int flt_stride;
  int32_t *flt;
  __m256i xq_coeff_1;
  int xq_active;
  __m256i sum64_1;
  __m256i sum64_0;
  int32_t e;
  int32_t v;
  int32_t u;
  __m256i err0;
  __m256i e0;
  __m256i vr1;
  __m256i vr0;
  __m256i v1;
  __m256i v0;
  __m256i flt1_0_sub_u;
  __m256i flt0_0_sub_u;
  __m256i u0;
  __m256i flt1_16b;
  __m256i flt0_16b;
  __m256i s0;
  __m256i d0;
  __m256i sum32;
  __m256i xq_coeff;
  int64_t err;
  uint8_t *dat;
  uint8_t *src;
  __m256i sum64;
  __m256i rounding;
  int32_t shift;
  int k;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffed40;
  undefined4 in_stack_ffffffffffffed48;
  int in_stack_ffffffffffffed4c;
  int in_stack_ffffffffffffed50;
  undefined4 in_stack_ffffffffffffed54;
  undefined8 uStack_12a8;
  int local_1294;
  void *in_stack_ffffffffffffed70;
  int local_1284;
  long local_1220;
  long local_1218;
  long local_1210;
  long local_1208;
  undefined1 local_1120 [32];
  void *local_f48;
  long local_cb8;
  long local_cb0;
  long local_ca8;
  undefined1 local_ca0 [32];
  int local_c58;
  int local_c54;
  int local_c50;
  undefined8 local_bc0;
  ulong uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar14 = vpinsrd_avx(ZEXT416(0x400),0x400,1);
  auVar14 = vpinsrd_avx(auVar14,0x400,2);
  auVar14 = vpinsrd_avx(auVar14,0x400,3);
  auVar13 = vpinsrd_avx(ZEXT416(0x400),0x400,1);
  auVar13 = vpinsrd_avx(auVar13,0x400,2);
  auVar13 = vpinsrd_avx(auVar13,0x400,3);
  uStack_70 = auVar13._0_8_;
  uStack_68 = auVar13._8_8_;
  local_bc0 = 0;
  uStack_bb8 = SUB328(ZEXT832(0),4);
  uStack_bb0 = 0;
  uStack_ba8 = 0;
  local_ca0 = ZEXT832(uStack_bb8) << 0x40;
  local_cb8 = 0;
  local_cb0 = in_R8;
  local_ca8 = in_RDI;
  if ((*xq < 1) || (xq[1] < 1)) {
    if ((*xq < 1) && (xq[1] < 1)) {
      local_1120 = ZEXT832(0) << 0x20;
      auVar18 = ZEXT3264(local_1120);
      for (local_c50 = 0; local_c50 < in_EDX; local_c50 = local_c50 + 1) {
        for (local_c54 = 0; local_c54 <= in_ESI + -0x10; local_c54 = local_c54 + 0x10) {
          auVar14 = auVar18._0_16_;
          xx_loadu_128((void *)(local_cb0 + local_c54));
          auVar1 = vpmovzxbw_avx2(auVar14);
          auVar14 = auVar1._0_16_;
          xx_loadu_128((void *)(local_ca8 + local_c54));
          auVar15 = vpmovzxbw_avx2(auVar14);
          auVar1 = vpsubw_avx2(auVar1,auVar15);
          auVar1 = vpmaddwd_avx2(auVar1,auVar1);
          local_1120 = vpaddd_avx2(local_1120,auVar1);
          auVar18 = ZEXT3264(local_1120);
        }
        for (local_c58 = local_c54; local_c58 < in_ESI; local_c58 = local_c58 + 1) {
          iVar11 = (uint)*(byte *)(local_cb0 + local_c58) - (uint)*(byte *)(local_ca8 + local_c58);
          local_cb8 = (long)iVar11 * (long)iVar11 + local_cb8;
        }
        local_cb0 = local_cb0 + in_R9D;
        local_ca8 = local_ca8 + in_ECX;
      }
      auVar1 = vpmovsxdq_avx2(local_1120._0_16_);
      auVar15 = vpmovsxdq_avx2(local_1120._16_16_);
      vpaddq_avx2(auVar1,auVar15);
    }
    else {
      if (*xq < 1) {
        local_1284 = *(int *)(CONCAT44(in_stack_0000002c,flt1_stride) + 4);
      }
      else {
        local_1284 = *(int *)CONCAT44(in_stack_0000002c,flt1_stride);
      }
      pvVar12 = (void *)(ulong)(uint)(local_1284 * -0x10);
      pair_set_epi16(in_stack_ffffffffffffed50,in_stack_ffffffffffffed4c);
      in_stack_ffffffffffffed70 = _flt0_stride;
      if (0 < *xq) {
        in_stack_ffffffffffffed70 = in_stack_00000008;
      }
      if (*xq < 1) {
        local_1294 = (int)flt1;
      }
      else {
        local_1294 = (int)flt0;
      }
      local_f48 = in_stack_ffffffffffffed70;
      for (local_c50 = 0; local_c50 < in_EDX; local_c50 = local_c50 + 1) {
        auVar1 = ZEXT1632(ZEXT816(0));
        for (local_c54 = 0; auVar13 = auVar1._0_16_, local_c54 <= in_ESI + -0x10;
            local_c54 = local_c54 + 0x10) {
          xx_loadu_128((void *)(local_cb0 + local_c54));
          auVar2 = vpmovzxbw_avx2(auVar13);
          auVar13 = auVar2._0_16_;
          xx_loadu_128((void *)(local_ca8 + local_c54));
          auVar3 = vpmovzxbw_avx2(auVar13);
          auVar17 = auVar3;
          yy_loadu_256((__m256i *)((long)local_f48 + (long)local_c54 * 4),pvVar12);
          in_stack_ffffffffffffed40 = auVar17._0_8_;
          in_stack_ffffffffffffed48 = auVar17._8_4_;
          in_stack_ffffffffffffed4c = auVar17._12_4_;
          in_stack_ffffffffffffed50 = auVar17._16_4_;
          in_stack_ffffffffffffed54 = auVar17._20_4_;
          uStack_12a8 = auVar17._24_8_;
          yy_loadu_256((__m256i *)((long)local_f48 + (long)local_c54 * 4 + 0x20),pvVar12);
          auVar15._12_4_ = in_stack_ffffffffffffed4c;
          auVar15._8_4_ = in_stack_ffffffffffffed48;
          auVar15._20_4_ = in_stack_ffffffffffffed54;
          auVar15._16_4_ = in_stack_ffffffffffffed50;
          auVar15._0_8_ = in_stack_ffffffffffffed40;
          auVar15._24_8_ = uStack_12a8;
          auVar15 = vpackssdw_avx2(auVar15,auVar17);
          auVar17 = vpermq_avx2(auVar15,0xd8);
          auVar15 = vpunpcklwd_avx2(auVar17,auVar2);
          auVar4._8_8_ = uStack_bb8;
          auVar4._0_8_ = local_bc0;
          auVar4._16_8_ = uStack_bb0;
          auVar4._24_8_ = uStack_ba8;
          auVar15 = vpmaddwd_avx2(auVar4,auVar15);
          auVar17 = vpunpckhwd_avx2(auVar17,auVar2);
          auVar16._8_8_ = uStack_bb8;
          auVar16._0_8_ = local_bc0;
          auVar16._16_8_ = uStack_bb0;
          auVar16._24_8_ = uStack_ba8;
          auVar17 = vpmaddwd_avx2(auVar16,auVar17);
          auVar8._16_8_ = uStack_70;
          auVar8._0_16_ = auVar14;
          auVar8._24_8_ = uStack_68;
          auVar15 = vpaddd_avx2(auVar15,auVar8);
          auVar16 = vpsrad_avx2(auVar15,ZEXT416(0xb));
          auVar7._16_8_ = uStack_70;
          auVar7._0_16_ = auVar14;
          auVar7._24_8_ = uStack_68;
          auVar15 = vpaddd_avx2(auVar17,auVar7);
          auVar15 = vpsrad_avx2(auVar15,ZEXT416(0xb));
          auVar15 = vpackssdw_avx2(auVar16,auVar15);
          auVar15 = vpaddw_avx2(auVar15,auVar2);
          auVar15 = vpsubw_avx2(auVar15,auVar3);
          auVar15 = vpmaddwd_avx2(auVar15,auVar15);
          auVar1 = vpaddd_avx2(auVar1,auVar15);
        }
        for (local_c58 = local_c54; local_c58 < in_ESI; local_c58 = local_c58 + 1) {
          iVar11 = (((int)(local_1284 *
                           (*(int *)((long)local_f48 + (long)local_c58 * 4) +
                           (uint)*(byte *)(local_cb0 + local_c58) * -0x10) + 0x400) >> 0xb) +
                   (uint)*(byte *)(local_cb0 + local_c58)) - (uint)*(byte *)(local_ca8 + local_c58);
          local_cb8 = (long)iVar11 * (long)iVar11 + local_cb8;
        }
        local_cb0 = local_cb0 + in_R9D;
        local_ca8 = local_ca8 + in_ECX;
        local_f48 = (void *)((long)local_f48 + (long)local_1294 * 4);
        auVar15 = vpmovsxdq_avx2(auVar13);
        auVar17 = vpmovsxdq_avx2(auVar1._16_16_);
        auVar1 = vpaddq_avx2(local_ca0,auVar15);
        local_ca0 = vpaddq_avx2(auVar1,auVar17);
      }
    }
  }
  else {
    pvVar12 = (void *)(ulong)*(uint *)(CONCAT44(in_stack_0000002c,flt1_stride) + 4);
    pair_set_epi16(in_stack_ffffffffffffed50,in_stack_ffffffffffffed4c);
    for (local_c50 = 0; local_c50 < in_EDX; local_c50 = local_c50 + 1) {
      auVar1 = ZEXT1632(ZEXT816(0));
      for (local_c54 = 0; auVar13 = auVar1._0_16_, local_c54 <= in_ESI + -0x10;
          local_c54 = local_c54 + 0x10) {
        xx_loadu_128((void *)(local_cb0 + local_c54));
        auVar2 = vpmovzxbw_avx2(auVar13);
        auVar13 = auVar2._0_16_;
        xx_loadu_128((void *)(local_ca8 + local_c54));
        auVar3 = vpmovzxbw_avx2(auVar13);
        auVar17 = auVar3;
        yy_loadu_256((__m256i *)((long)in_stack_00000008 + (long)local_c54 * 4),pvVar12);
        auVar15 = auVar17;
        yy_loadu_256((__m256i *)((long)in_stack_00000008 + (long)local_c54 * 4 + 0x20),pvVar12);
        auVar15 = vpackssdw_avx2(auVar17,auVar15);
        auVar17 = vpermq_avx2(auVar15,0xd8);
        auVar16 = auVar17;
        yy_loadu_256((__m256i *)((long)_flt0_stride + (long)local_c54 * 4),pvVar12);
        auVar15 = auVar16;
        yy_loadu_256((__m256i *)((long)_flt0_stride + (long)local_c54 * 4 + 0x20),pvVar12);
        auVar15 = vpackssdw_avx2(auVar16,auVar15);
        auVar16 = vpermq_avx2(auVar15,0xd8);
        auVar15 = vpsllw_avx2(auVar2,ZEXT416(4));
        auVar17 = vpsubw_avx2(auVar17,auVar15);
        auVar16 = vpsubw_avx2(auVar16,auVar15);
        auVar15 = vpunpcklwd_avx2(auVar17,auVar16);
        auVar6._8_8_ = uStack_bb8;
        auVar6._0_8_ = local_bc0;
        auVar6._16_8_ = uStack_bb0;
        auVar6._24_8_ = uStack_ba8;
        auVar15 = vpmaddwd_avx2(auVar6,auVar15);
        auVar17 = vpunpckhwd_avx2(auVar17,auVar16);
        auVar5._8_8_ = uStack_bb8;
        auVar5._0_8_ = local_bc0;
        auVar5._16_8_ = uStack_bb0;
        auVar5._24_8_ = uStack_ba8;
        auVar17 = vpmaddwd_avx2(auVar5,auVar17);
        auVar10._16_8_ = uStack_70;
        auVar10._0_16_ = auVar14;
        auVar10._24_8_ = uStack_68;
        auVar15 = vpaddd_avx2(auVar15,auVar10);
        auVar16 = vpsrad_avx2(auVar15,ZEXT416(0xb));
        auVar9._16_8_ = uStack_70;
        auVar9._0_16_ = auVar14;
        auVar9._24_8_ = uStack_68;
        auVar15 = vpaddd_avx2(auVar17,auVar9);
        auVar15 = vpsrad_avx2(auVar15,ZEXT416(0xb));
        auVar15 = vpackssdw_avx2(auVar16,auVar15);
        auVar15 = vpaddw_avx2(auVar15,auVar2);
        auVar15 = vpsubw_avx2(auVar15,auVar3);
        auVar15 = vpmaddwd_avx2(auVar15,auVar15);
        auVar1 = vpaddd_avx2(auVar1,auVar15);
      }
      for (local_c58 = local_c54; local_c58 < in_ESI; local_c58 = local_c58 + 1) {
        pvVar12 = (void *)(long)local_c58;
        iVar11 = (((int)(*(int *)CONCAT44(in_stack_0000002c,flt1_stride) *
                         (*(int *)((long)in_stack_00000008 + (long)local_c58 * 4) +
                         (uint)*(byte *)(local_cb0 + local_c58) * -0x10) +
                         *(int *)(CONCAT44(in_stack_0000002c,flt1_stride) + 4) *
                         (*(int *)((long)_flt0_stride + (long)pvVar12 * 4) +
                         (uint)*(byte *)(local_cb0 + local_c58) * -0x10) + 0x400) >> 0xb) +
                 (uint)*(byte *)(local_cb0 + local_c58)) - (uint)*(byte *)(local_ca8 + local_c58);
        local_cb8 = (long)iVar11 * (long)iVar11 + local_cb8;
      }
      local_cb0 = local_cb0 + in_R9D;
      local_ca8 = local_ca8 + in_ECX;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (long)(int)flt0 * 4);
      _flt0_stride = (void *)((long)_flt0_stride + (long)(int)flt1 * 4);
      auVar15 = vpmovsxdq_avx2(auVar13);
      auVar17 = vpmovsxdq_avx2(auVar1._16_16_);
      auVar1 = vpaddq_avx2(local_ca0,auVar15);
      local_ca0 = vpaddq_avx2(auVar1,auVar17);
    }
  }
  v_00[1] = in_stack_ffffffffffffed40;
  v_00[0] = 0xab5a5e;
  v_00[2]._0_4_ = in_stack_ffffffffffffed48;
  v_00[2]._4_4_ = in_stack_ffffffffffffed4c;
  v_00[3]._0_4_ = in_stack_ffffffffffffed50;
  v_00[3]._4_4_ = in_stack_ffffffffffffed54;
  yy_storeu_256(in_stack_ffffffffffffed70,v_00);
  return local_1220 + local_1218 + local_1210 + local_1208 + local_cb8;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_avx2(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m256i rounding = _mm256_set1_epi32(1 << (shift - 1));
  __m256i sum64 = _mm256_setzero_si256();
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    __m256i xq_coeff = pair_set_epi16(xq[0], xq[1]);
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i flt0_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt0 + j),
                               yy_loadu_256(flt0 + j + 8)),
            0xd8);
        const __m256i flt1_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt1 + j),
                               yy_loadu_256(flt1 + j + 8)),
            0xd8);
        const __m256i u0 = _mm256_slli_epi16(d0, SGRPROJ_RST_BITS);
        const __m256i flt0_0_sub_u = _mm256_sub_epi16(flt0_16b, u0);
        const __m256i flt1_0_sub_u = _mm256_sub_epi16(flt1_16b, u0);
        const __m256i v0 = _mm256_madd_epi16(
            xq_coeff, _mm256_unpacklo_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m256i v1 = _mm256_madd_epi16(
            xq_coeff, _mm256_unpackhi_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m256i vr0 =
            _mm256_srai_epi32(_mm256_add_epi32(v0, rounding), shift);
        const __m256i vr1 =
            _mm256_srai_epi32(_mm256_add_epi32(v1, rounding), shift);
        const __m256i e0 = _mm256_sub_epi16(
            _mm256_add_epi16(_mm256_packs_epi32(vr0, vr1), d0), s0);
        const __m256i err0 = _mm256_madd_epi16(e0, e0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      const __m256i sum64_0 =
          _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
      const __m256i sum64_1 =
          _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum64_0);
      sum64 = _mm256_add_epi64(sum64, sum64_1);
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    const int xq_active = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m256i xq_coeff =
        pair_set_epi16(xq_active, -xq_active * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i flt_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt + j),
                               yy_loadu_256(flt + j + 8)),
            0xd8);
        const __m256i v0 =
            _mm256_madd_epi16(xq_coeff, _mm256_unpacklo_epi16(flt_16b, d0));
        const __m256i v1 =
            _mm256_madd_epi16(xq_coeff, _mm256_unpackhi_epi16(flt_16b, d0));
        const __m256i vr0 =
            _mm256_srai_epi32(_mm256_add_epi32(v0, rounding), shift);
        const __m256i vr1 =
            _mm256_srai_epi32(_mm256_add_epi32(v1, rounding), shift);
        const __m256i e0 = _mm256_sub_epi16(
            _mm256_add_epi16(_mm256_packs_epi32(vr0, vr1), d0), s0);
        const __m256i err0 = _mm256_madd_epi16(e0, e0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_active * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
      const __m256i sum64_0 =
          _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
      const __m256i sum64_1 =
          _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum64_0);
      sum64 = _mm256_add_epi64(sum64, sum64_1);
    }
  } else {
    __m256i sum32 = _mm256_setzero_si256();
    for (i = 0; i < height; ++i) {
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i diff0 = _mm256_sub_epi16(d0, s0);
        const __m256i err0 = _mm256_madd_epi16(diff0, diff0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
    const __m256i sum64_0 =
        _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
    const __m256i sum64_1 =
        _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
    sum64 = _mm256_add_epi64(sum64_0, sum64_1);
  }
  int64_t sum[4];
  yy_storeu_256(sum, sum64);
  err += sum[0] + sum[1] + sum[2] + sum[3];
  return err;
}